

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O3

int run_test_tcp_create_early_bad_bind(void)

{
  ushort uVar1;
  int iVar2;
  int extraout_EAX;
  anon_union_28_2_e90107a3_for_address *paVar3;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  ulong uVar6;
  char *handle;
  bool bVar7;
  uv_os_fd_t fd;
  int namelen;
  sockaddr_in6 sockname;
  sockaddr_in addr;
  uv_tcp_t client;
  sockaddr_in sStack_4b8;
  uv_tcp_t uStack_4a8;
  undefined1 auStack_3b0 [344];
  code *pcStack_258;
  uv_tcp_t uStack_248;
  uv_loop_t *puStack_150;
  int local_13c [2];
  sockaddr local_134;
  sockaddr_in local_118;
  uv_tcp_t local_108;
  
  puStack_150 = (uv_loop_t *)0x16ff3f;
  iVar2 = uv_interface_addresses((uv_interface_address_t **)&local_108,(int *)&local_134);
  if (iVar2 != 0) {
LAB_00170095:
    puStack_150 = (uv_loop_t *)0x17009a;
    run_test_tcp_create_early_bad_bind_cold_1();
    return 1;
  }
  if ((long)(int)local_134._0_4_ < 1) {
    puStack_150 = (uv_loop_t *)0x170095;
    uv_free_interface_addresses((uv_interface_address_t *)local_108.data,local_134._0_4_);
    goto LAB_00170095;
  }
  paVar3 = (anon_union_28_2_e90107a3_for_address *)((long)local_108.data + 0x14);
  uVar6 = 1;
  do {
    uVar1 = (paVar3->address4).sin_family;
    puVar5 = (uv_loop_t *)(ulong)uVar1;
    if (uVar1 == 10) break;
    paVar3 = (anon_union_28_2_e90107a3_for_address *)((long)paVar3 + 0x50);
    bVar7 = uVar6 < (ulong)(long)(int)local_134._0_4_;
    uVar6 = uVar6 + 1;
  } while (bVar7);
  puStack_150 = (uv_loop_t *)0x16ff81;
  uv_free_interface_addresses((uv_interface_address_t *)local_108.data,local_134._0_4_);
  if (uVar1 != 10) goto LAB_00170095;
  puStack_150 = (uv_loop_t *)0x16ffa1;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&local_118);
  if (iVar2 == 0) {
    puStack_150 = (uv_loop_t *)0x16ffae;
    puVar4 = uv_default_loop();
    puStack_150 = (uv_loop_t *)0x16ffc0;
    iVar2 = uv_tcp_init_ex(puVar4,&local_108,10);
    if (iVar2 != 0) goto LAB_001700a6;
    puStack_150 = (uv_loop_t *)0x16ffd7;
    iVar2 = uv_fileno((uv_handle_t *)&local_108,local_13c);
    if (iVar2 != 0) goto LAB_001700ab;
    if (local_13c[0] == -1) goto LAB_001700b0;
    local_13c[1] = UV_SIGNAL|UV_TCP;
    puStack_150 = (uv_loop_t *)0x170004;
    iVar2 = uv_tcp_getsockname(&local_108,&local_134,local_13c + 1);
    if (iVar2 != 0) goto LAB_001700b5;
    if (local_134.sa_family != 10) goto LAB_001700ba;
    puVar5 = (uv_loop_t *)0x0;
    puStack_150 = (uv_loop_t *)0x17002b;
    iVar2 = uv_tcp_bind(&local_108,(sockaddr *)&local_118,0);
    if (iVar2 != -0x16) goto LAB_001700bf;
    puStack_150 = (uv_loop_t *)0x170040;
    uv_close((uv_handle_t *)&local_108,(uv_close_cb)0x0);
    puStack_150 = (uv_loop_t *)0x170045;
    puVar4 = uv_default_loop();
    puStack_150 = (uv_loop_t *)0x17004f;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_150 = (uv_loop_t *)0x170054;
    puVar4 = uv_default_loop();
    puStack_150 = (uv_loop_t *)0x170068;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    puStack_150 = (uv_loop_t *)0x170072;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_150 = (uv_loop_t *)0x170077;
    puVar4 = uv_default_loop();
    puStack_150 = (uv_loop_t *)0x17007f;
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_150 = (uv_loop_t *)0x1700a6;
    run_test_tcp_create_early_bad_bind_cold_2();
LAB_001700a6:
    puStack_150 = (uv_loop_t *)0x1700ab;
    run_test_tcp_create_early_bad_bind_cold_3();
LAB_001700ab:
    puStack_150 = (uv_loop_t *)0x1700b0;
    run_test_tcp_create_early_bad_bind_cold_4();
LAB_001700b0:
    puStack_150 = (uv_loop_t *)0x1700b5;
    run_test_tcp_create_early_bad_bind_cold_9();
LAB_001700b5:
    puStack_150 = (uv_loop_t *)0x1700ba;
    run_test_tcp_create_early_bad_bind_cold_5();
LAB_001700ba:
    puStack_150 = (uv_loop_t *)0x1700bf;
    run_test_tcp_create_early_bad_bind_cold_6();
LAB_001700bf:
    puStack_150 = (uv_loop_t *)0x1700c4;
    run_test_tcp_create_early_bad_bind_cold_7();
  }
  puStack_150 = (uv_loop_t *)run_test_tcp_create_early_bad_domain;
  run_test_tcp_create_early_bad_bind_cold_8();
  pcStack_258 = (code *)0x1700d6;
  puStack_150 = puVar5;
  puVar4 = uv_default_loop();
  pcStack_258 = (code *)0x1700e8;
  iVar2 = uv_tcp_init_ex(puVar4,&uStack_248,0x2f);
  if (iVar2 == -0x16) {
    pcStack_258 = (code *)0x1700f2;
    puVar4 = uv_default_loop();
    pcStack_258 = (code *)0x170104;
    iVar2 = uv_tcp_init_ex(puVar4,&uStack_248,0x400);
    if (iVar2 != -0x16) goto LAB_0017015c;
    pcStack_258 = (code *)0x17010e;
    puVar5 = uv_default_loop();
    pcStack_258 = (code *)0x170118;
    uv_run(puVar5,UV_RUN_DEFAULT);
    pcStack_258 = (code *)0x17011d;
    puVar5 = uv_default_loop();
    pcStack_258 = (code *)0x170131;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    pcStack_258 = (code *)0x17013b;
    uv_run(puVar5,UV_RUN_DEFAULT);
    pcStack_258 = (code *)0x170140;
    puVar4 = uv_default_loop();
    pcStack_258 = (code *)0x170148;
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_258 = (code *)0x17015c;
    run_test_tcp_create_early_bad_domain_cold_1();
LAB_0017015c:
    pcStack_258 = (code *)0x170161;
    run_test_tcp_create_early_bad_domain_cold_2();
  }
  pcStack_258 = run_test_tcp_create_early_accept;
  run_test_tcp_create_early_bad_domain_cold_3();
  pcStack_258 = (code *)puVar5;
  puVar5 = uv_default_loop();
  handle = "0.0.0.0";
  iVar2 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&uStack_4a8);
  if (iVar2 == 0) {
    iVar2 = uv_tcp_init(puVar5,(uv_tcp_t *)auStack_3b0);
    handle = (char *)puVar5;
    if (iVar2 != 0) goto LAB_00170295;
    handle = auStack_3b0;
    iVar2 = uv_tcp_bind((uv_tcp_t *)handle,(sockaddr *)&uStack_4a8,0);
    if (iVar2 != 0) goto LAB_0017029a;
    handle = auStack_3b0;
    iVar2 = uv_listen((uv_stream_t *)handle,0x80,on_connection);
    if (iVar2 != 0) goto LAB_0017029f;
    puVar5 = uv_default_loop();
    handle = "127.0.0.1";
    iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_4b8);
    if (iVar2 != 0) goto LAB_001702a4;
    iVar2 = uv_tcp_init(puVar5,&uStack_4a8);
    if (iVar2 != 0) goto LAB_001702a9;
    puVar5 = (uv_loop_t *)(auStack_3b0 + 0xf8);
    iVar2 = uv_tcp_connect((uv_connect_t *)puVar5,&uStack_4a8,(sockaddr *)&sStack_4b8,on_connect);
    if (iVar2 == 0) {
      puVar5 = uv_default_loop();
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar2 = uv_loop_close(puVar5);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_001702b3;
    }
  }
  else {
    run_test_tcp_create_early_accept_cold_1();
LAB_00170295:
    run_test_tcp_create_early_accept_cold_2();
LAB_0017029a:
    run_test_tcp_create_early_accept_cold_3();
LAB_0017029f:
    run_test_tcp_create_early_accept_cold_4();
LAB_001702a4:
    puVar5 = (uv_loop_t *)handle;
    run_test_tcp_create_early_accept_cold_5();
LAB_001702a9:
    run_test_tcp_create_early_accept_cold_6();
  }
  run_test_tcp_create_early_accept_cold_7();
LAB_001702b3:
  run_test_tcp_create_early_accept_cold_8();
  iVar2 = uv_is_closing((uv_handle_t *)puVar5);
  if (iVar2 == 0) {
    uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_create_early_bad_bind) {
  struct sockaddr_in addr;
  uv_tcp_t client;
  uv_os_fd_t fd;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init_ex(uv_default_loop(), &client, AF_INET6);
  ASSERT(r == 0);

  r = uv_fileno((const uv_handle_t*) &client, &fd);
  ASSERT(r == 0);
  ASSERT(fd != INVALID_FD);

  /* Windows returns WSAEINVAL if the socket is not bound */
#ifndef _WIN32
  {
    int namelen;
    struct sockaddr_in6 sockname;
    namelen = sizeof sockname;
    r = uv_tcp_getsockname(&client, (struct sockaddr*) &sockname, &namelen);
    ASSERT(r == 0);
    ASSERT(sockname.sin6_family == AF_INET6);
  }
#endif

  r = uv_tcp_bind(&client, (const struct sockaddr*) &addr, 0);
#if !defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MSYS__)
  ASSERT(r == UV_EINVAL);
#else
  ASSERT(r == UV_EFAULT);
#endif

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}